

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

void __thiscall
flatbuffers::cpp::CppGenerator::GenArrayAccessor
          (CppGenerator *this,Type *type,bool mutable_accessor)

{
  Type *__return_storage_ptr__;
  string *__return_storage_ptr___00;
  bool bVar1;
  allocator<char> local_239;
  string local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  byte local_1d3;
  allocator<char> local_1d2;
  byte local_1d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  undefined1 local_1b0 [8];
  string get_array;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_80 [8];
  string ret_type;
  string face_type;
  bool is_enum;
  bool mutable_accessor_local;
  Type *type_local;
  CppGenerator *this_local;
  
  bVar1 = IsArray(type);
  if (bVar1) {
    __return_storage_ptr__ = (Type *)((long)&face_type.field_2 + 8);
    Type::VectorType(__return_storage_ptr__,type);
    bVar1 = IsEnum(__return_storage_ptr__);
    __return_storage_ptr___00 = (string *)((long)&ret_type.field_2 + 8);
    GenTypeGet_abi_cxx11_(__return_storage_ptr___00,this,type," ","","",bVar1);
    std::operator+(&local_e0,"::flatbuffers::Array<",__return_storage_ptr___00);
    std::operator+(&local_c0,&local_e0,", ");
    NumToString<unsigned_short>(&local_110,type->fixed_length);
    std::operator+(&local_a0,&local_c0,&local_110);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                   &local_a0,">");
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    if (mutable_accessor) {
      std::operator+(&local_150,"  ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
      std::operator+(&local_130,&local_150," *mutable_{{FIELD_NAME}}() {");
      CodeWriter::operator+=(&this->code_,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_150);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&get_array.field_2 + 8),"  const ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
      std::operator+(&local_170,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&get_array.field_2 + 8)," *{{FIELD_NAME}}() const {");
      CodeWriter::operator+=(&this->code_,&local_170);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)(get_array.field_2._M_local_buf + 8));
    }
    local_1d1 = 0;
    local_1d3 = 0;
    if (bVar1) {
      std::operator+(&local_1d0,"CastToArrayOfEnum<",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&ret_type.field_2 + 8));
      local_1d1 = 1;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                     &local_1d0,">");
    }
    else {
      std::allocator<char>::allocator();
      local_1d3 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1b0,"CastToArray",&local_1d2);
    }
    if ((local_1d3 & 1) != 0) {
      std::allocator<char>::~allocator(&local_1d2);
    }
    if ((local_1d1 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_1d0);
    }
    std::operator+(&local_218,"    return &::flatbuffers::",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0);
    std::operator+(&local_1f8,&local_218,"({{FIELD_VALUE}});");
    CodeWriter::operator+=(&this->code_,&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_218);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"  }",&local_239);
    CodeWriter::operator+=(&this->code_,&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    std::allocator<char>::~allocator(&local_239);
    std::__cxx11::string::~string((string *)local_1b0);
    std::__cxx11::string::~string((string *)local_80);
    std::__cxx11::string::~string((string *)(ret_type.field_2._M_local_buf + 8));
    return;
  }
  __assert_fail("IsArray(type)",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_cpp.cpp"
                ,0xf48,"void flatbuffers::cpp::CppGenerator::GenArrayAccessor(const Type &, bool)");
}

Assistant:

void GenArrayAccessor(const Type &type, bool mutable_accessor) {
    FLATBUFFERS_ASSERT(IsArray(type));
    const auto is_enum = IsEnum(type.VectorType());
    // The Array<bool,N> is a tricky case, like std::vector<bool>.
    // It requires a specialization of Array class.
    // Generate Array<uint8_t> for Array<bool>.
    const auto face_type = GenTypeGet(type, " ", "", "", is_enum);
    std::string ret_type = "::flatbuffers::Array<" + face_type + ", " +
                           NumToString(type.fixed_length) + ">";
    if (mutable_accessor)
      code_ += "  " + ret_type + " *mutable_{{FIELD_NAME}}() {";
    else
      code_ += "  const " + ret_type + " *{{FIELD_NAME}}() const {";

    std::string get_array =
        is_enum ? "CastToArrayOfEnum<" + face_type + ">" : "CastToArray";
    code_ += "    return &::flatbuffers::" + get_array + "({{FIELD_VALUE}});";
    code_ += "  }";
  }